

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::DecodeIntegerValues
          (SequentialQuantizationAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  int iVar2;
  
  if (((this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.decoder_)->
      version_major_ < 2) {
    iVar2 = (*(this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.
              _vptr_SequentialAttributeDecoder[0xd])(this);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  bVar1 = SequentialIntegerAttributeDecoder::DecodeIntegerValues
                    (&this->super_SequentialIntegerAttributeDecoder,point_ids,in_buffer);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0) &&
      !DecodeQuantizedDataInfo()) {
    return false;
  }
#endif
  return SequentialIntegerAttributeDecoder::DecodeIntegerValues(point_ids,
                                                                in_buffer);
}